

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void ActionInferTypes::propagateSpacebaseRef(Funcdata *data,Varnode *spcvn)

{
  bool bVar1;
  type_metatype tVar2;
  OpCode OVar3;
  uint uVar4;
  TypePointer *this;
  Datatype *this_00;
  reference ppPVar5;
  uintb uVar6;
  Varnode *pVVar7;
  uintb uVar8;
  undefined1 local_98 [24];
  uintb off;
  undefined1 local_70 [24];
  Varnode *vn;
  PcodeOp *op;
  _List_node_base *local_48;
  undefined1 local_40 [8];
  Address addr;
  const_iterator iter;
  TypeSpacebase *sbtype;
  Datatype *spctype;
  Varnode *spcvn_local;
  Funcdata *data_local;
  
  this = (TypePointer *)Varnode::getType(spcvn);
  tVar2 = Datatype::getMetatype((Datatype *)this);
  if (tVar2 == TYPE_PTR) {
    this_00 = TypePointer::getPtrTo(this);
    tVar2 = Datatype::getMetatype(this_00);
    if (tVar2 == TYPE_SPACEBASE) {
      std::_List_const_iterator<PcodeOp_*>::_List_const_iterator
                ((_List_const_iterator<PcodeOp_*> *)&addr.offset);
      Address::Address((Address *)local_40);
      local_48 = (_List_node_base *)Varnode::beginDescend(spcvn);
      addr.offset = (uintb)local_48;
      while( true ) {
        op = (PcodeOp *)Varnode::endDescend(spcvn);
        bVar1 = std::operator!=((_Self *)&addr.offset,(_Self *)&op);
        if (!bVar1) break;
        ppPVar5 = std::_List_const_iterator<PcodeOp_*>::operator*
                            ((_List_const_iterator<PcodeOp_*> *)&addr.offset);
        vn = (Varnode *)*ppPVar5;
        OVar3 = PcodeOp::code((PcodeOp *)vn);
        if (OVar3 == CPUI_COPY) {
          local_70._16_8_ = PcodeOp::getIn((PcodeOp *)vn,0);
          uVar4 = Varnode::getSize((Varnode *)local_70._16_8_);
          PcodeOp::getAddr((PcodeOp *)vn);
          TypeSpacebase::getAddress
                    ((TypeSpacebase *)local_70,(uintb)this_00,0,(Address *)(ulong)uVar4);
          Address::operator=((Address *)local_40,(Address *)local_70);
          pVVar7 = PcodeOp::getOut((PcodeOp *)vn);
          propagateRef(data,pVVar7,(Address *)local_40);
        }
        else if (OVar3 == CPUI_INT_ADD) {
LAB_00666c5b:
          local_70._16_8_ = PcodeOp::getIn((PcodeOp *)vn,1);
          bVar1 = Varnode::isConstant((Varnode *)local_70._16_8_);
          if (bVar1) {
            uVar6 = Varnode::getOffset((Varnode *)local_70._16_8_);
            uVar4 = Varnode::getSize((Varnode *)local_70._16_8_);
            PcodeOp::getAddr((PcodeOp *)vn);
            TypeSpacebase::getAddress
                      ((TypeSpacebase *)&off,(uintb)this_00,(int4)uVar6,(Address *)(ulong)uVar4);
            Address::operator=((Address *)local_40,(Address *)&off);
            pVVar7 = PcodeOp::getOut((PcodeOp *)vn);
            propagateRef(data,pVVar7,(Address *)local_40);
          }
        }
        else if (OVar3 == CPUI_PTRADD) {
          local_70._16_8_ = PcodeOp::getIn((PcodeOp *)vn,1);
          bVar1 = Varnode::isConstant((Varnode *)local_70._16_8_);
          if (bVar1) {
            uVar6 = Varnode::getOffset((Varnode *)local_70._16_8_);
            pVVar7 = PcodeOp::getIn((PcodeOp *)vn,2);
            uVar8 = Varnode::getOffset(pVVar7);
            local_98._16_8_ = uVar6 * uVar8;
            uVar4 = Varnode::getSize((Varnode *)local_70._16_8_);
            PcodeOp::getAddr((PcodeOp *)vn);
            TypeSpacebase::getAddress
                      ((TypeSpacebase *)local_98,(uintb)this_00,(int4)(uVar6 * uVar8),
                       (Address *)(ulong)uVar4);
            Address::operator=((Address *)local_40,(Address *)local_98);
            pVVar7 = PcodeOp::getOut((PcodeOp *)vn);
            propagateRef(data,pVVar7,(Address *)local_40);
          }
        }
        else if (OVar3 == CPUI_PTRSUB) goto LAB_00666c5b;
        std::_List_const_iterator<PcodeOp_*>::operator++
                  ((_List_const_iterator<PcodeOp_*> *)&addr.offset);
      }
    }
  }
  return;
}

Assistant:

void ActionInferTypes::propagateSpacebaseRef(Funcdata &data,Varnode *spcvn)

{
  Datatype *spctype = spcvn->getType();	// This is an absolute property of the varnode, so not temptype
  if (spctype->getMetatype() != TYPE_PTR) return;
  spctype = ((TypePointer *)spctype)->getPtrTo();
  if (spctype->getMetatype() != TYPE_SPACEBASE) return;
  TypeSpacebase *sbtype = (TypeSpacebase *)spctype;
  list<PcodeOp *>::const_iterator iter;
  Address addr;

  for(iter=spcvn->beginDescend();iter!=spcvn->endDescend();++iter) {
    PcodeOp *op = *iter;
    Varnode *vn;
    switch(op->code()) {
    case CPUI_COPY:
      vn = op->getIn(0);
      addr = sbtype->getAddress(0,vn->getSize(),op->getAddr());
      propagateRef(data,op->getOut(),addr);
      break;
    case CPUI_INT_ADD:
    case CPUI_PTRSUB:
      vn = op->getIn(1);
      if (vn->isConstant()) {
	addr = sbtype->getAddress(vn->getOffset(),vn->getSize(),op->getAddr());
	propagateRef(data,op->getOut(),addr);
      }
      break;
    case CPUI_PTRADD:
      vn = op->getIn(1);
      if (vn->isConstant()) {
	uintb off = vn->getOffset() * op->getIn(2)->getOffset();
	addr = sbtype->getAddress(off,vn->getSize(),op->getAddr());
	propagateRef(data,op->getOut(),addr);
      }
      break;
    default:
      break;
    }
  }
}